

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int cfft1f_(int *n,int *inc,fft_complex_t *c__,int *lenc,double *wsave,int *lensav,double *work,
           int *lenwrk,int *ier)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int *in_RSI;
  int *in_RDI;
  int *in_R9;
  double dVar3;
  double dVar4;
  int *in_stack_00000010;
  undefined4 *in_stack_00000018;
  int iw1;
  
  *in_stack_00000018 = 0;
  if (*in_RCX < *in_RSI * (*in_RDI + -1) + 1) {
    *in_stack_00000018 = 1;
  }
  else {
    iVar1 = *in_R9;
    iVar2 = *in_RDI;
    dVar3 = log((double)*in_RDI);
    dVar4 = log(2.0);
    if (iVar1 < iVar2 * 2 + (int)(dVar3 / dVar4) + 4) {
      *in_stack_00000018 = 2;
    }
    else if (SBORROW4(*in_stack_00000010,*in_RDI * 2) != *in_stack_00000010 + *in_RDI * -2 < 0) {
      *in_stack_00000018 = 3;
    }
  }
  if (*in_RDI != 1) {
    c1fm1f_(n,inc,c__,(double *)lenc,wsave,(double *)lensav,(double *)ier);
  }
  return 0;
}

Assistant:

int cfft1f_(int *n, int *inc, complex *c__, int *
	lenc, fft_real_t *wsave, int *lensav, fft_real_t *work, int *lenwrk,
	int *ier)
{

    /* Local variables */
     int iw1;
    extern /* Subroutine */ int c1fm1f_(int *, int *, complex *, fft_real_t
	    *, fft_real_t *, fft_real_t *, fft_real_t *), xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    --c__;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;

    if (*lenc < *inc * (*n - 1) + 1) {
	*ier = 1;
	////xerfft_("CFFT1F ", &c__4, (ftnlen)7);
    } else if (*lensav < (*n << 1) + (int) (log((fft_real_t) (*n)) / log(2.0))
	    + 4) {
	*ier = 2;
	////xerfft_("CFFT1F ", &c__6, (ftnlen)7);
    } else if (*lenwrk < *n << 1) {
	*ier = 3;
	////xerfft_("CFFT1F ", &c__8, (ftnlen)7);
    }

    if (*n == 1) {
	return 0;
    }

    iw1 = *n + *n + 1;
    c1fm1f_(n, inc, &c__[1], &work[1], &wsave[1], &wsave[iw1], &wsave[iw1 + 1]
	    );
    return 0;
}